

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfont.cpp
# Opt level: O0

void __thiscall QFont::setStrikeOut(QFont *this,bool enable)

{
  byte bVar1;
  QFontPrivate *pQVar2;
  byte in_SIL;
  long in_RDI;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  
  bVar1 = in_SIL & 1;
  if (((*(uint *)(in_RDI + 8) & 0x100) == 0) ||
     (pQVar2 = QExplicitlySharedDataPointer<QFontPrivate>::operator->
                         ((QExplicitlySharedDataPointer<QFontPrivate> *)0x712457),
     ((byte)pQVar2->field_0x7c >> 2 & 1) != bVar1)) {
    QFontPrivate::detachButKeepEngineData
              ((QFont *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
    pQVar2 = QExplicitlySharedDataPointer<QFontPrivate>::operator->
                       ((QExplicitlySharedDataPointer<QFontPrivate> *)0x712493);
    pQVar2->field_0x7c = pQVar2->field_0x7c & 0xfb | (bVar1 & 1) << 2;
    *(uint *)(in_RDI + 8) = *(uint *)(in_RDI + 8) | 0x100;
  }
  return;
}

Assistant:

void QFont::setStrikeOut(bool enable)
{
    if ((resolve_mask & QFont::StrikeOutResolved) && d->strikeOut == enable)
        return;

    QFontPrivate::detachButKeepEngineData(this);

    d->strikeOut = enable;
    resolve_mask |= QFont::StrikeOutResolved;
}